

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinimizerParameters.cpp
# Opt level: O3

void __thiscall OpenMD::MinimizerParameters::MinimizerParameters(MinimizerParameters *this)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  ParamMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  string *local_a0;
  ParameterBase *local_98;
  string *local_90;
  ParameterBase *local_88;
  string *local_80;
  ParameterBase *local_78;
  string *local_70;
  ParameterBase *local_68;
  string *local_60;
  ParameterBase *local_58;
  string *local_50;
  ParameterBase *local_48;
  string *local_40;
  Parameter<bool> *local_38;
  
  p_Var1 = &(this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->super_DataHolder).parameters_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header.
  _M_parent = (_Base_ptr)0x0;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_left
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var1->_M_header;
  (this->super_DataHolder).deprecatedKeywords_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_DataHolder)._vptr_DataHolder = (_func_int **)&PTR__MinimizerParameters_0033b958;
  psVar2 = &(this->UseMinimizer).super_ParameterBase.keyword_;
  local_a8 = &(this->UseMinimizer).super_ParameterBase.keyword_.field_2;
  (this->UseMinimizer).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_a8;
  (this->UseMinimizer).super_ParameterBase.keyword_._M_string_length = 0;
  (this->UseMinimizer).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->UseMinimizer).super_ParameterBase.optional_ = false;
  (this->UseMinimizer).super_ParameterBase.defaultValue_ = false;
  (this->UseMinimizer).super_ParameterBase.empty_ = true;
  (this->UseMinimizer).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033ac68;
  local_48 = &(this->Method).super_ParameterBase;
  (this->Method).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)&(this->Method).super_ParameterBase.keyword_.field_2;
  (this->Method).super_ParameterBase.keyword_._M_string_length = 0;
  (this->Method).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->Method).super_ParameterBase.optional_ = false;
  (this->Method).super_ParameterBase.defaultValue_ = false;
  (this->Method).super_ParameterBase.empty_ = true;
  (this->Method).super_ParameterBase._vptr_ParameterBase = (_func_int **)&PTR__Parameter_0033a8f0;
  (this->Method).data_._M_dataplus._M_p = (pointer)&(this->Method).data_.field_2;
  (this->Method).data_._M_string_length = 0;
  (this->Method).data_.field_2._M_local_buf[0] = '\0';
  local_58 = &(this->MaxIterations).super_ParameterBase;
  local_b0 = &(this->MaxIterations).super_ParameterBase.keyword_.field_2;
  (this->MaxIterations).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_b0;
  (this->MaxIterations).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MaxIterations).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MaxIterations).super_ParameterBase.optional_ = false;
  (this->MaxIterations).super_ParameterBase.defaultValue_ = false;
  (this->MaxIterations).super_ParameterBase.empty_ = true;
  (this->MaxIterations).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033ad58;
  local_b8 = &(this->MaxStationaryStateIterations).super_ParameterBase.keyword_.field_2;
  (this->MaxStationaryStateIterations).super_ParameterBase.keyword_._M_dataplus._M_p =
       (pointer)local_b8;
  (this->MaxStationaryStateIterations).super_ParameterBase.keyword_._M_string_length = 0;
  (this->MaxStationaryStateIterations).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->MaxStationaryStateIterations).super_ParameterBase.optional_ = false;
  (this->MaxStationaryStateIterations).super_ParameterBase.defaultValue_ = false;
  (this->MaxStationaryStateIterations).super_ParameterBase.empty_ = true;
  (this->MaxStationaryStateIterations).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033ad58;
  local_c0 = &(this->RootEpsilon).super_ParameterBase.keyword_.field_2;
  (this->RootEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_c0;
  (this->RootEpsilon).super_ParameterBase.keyword_._M_string_length = 0;
  (this->RootEpsilon).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->RootEpsilon).super_ParameterBase.optional_ = false;
  (this->RootEpsilon).super_ParameterBase.defaultValue_ = false;
  (this->RootEpsilon).super_ParameterBase.empty_ = true;
  (this->RootEpsilon).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033ace0;
  local_c8 = &(this->FunctionEpsilon).super_ParameterBase.keyword_.field_2;
  (this->FunctionEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_c8;
  (this->FunctionEpsilon).super_ParameterBase.keyword_._M_string_length = 0;
  (this->FunctionEpsilon).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->FunctionEpsilon).super_ParameterBase.optional_ = false;
  (this->FunctionEpsilon).super_ParameterBase.defaultValue_ = false;
  (this->FunctionEpsilon).super_ParameterBase.empty_ = true;
  (this->FunctionEpsilon).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033ace0;
  local_d0 = &(this->GradientNormEpsilon).super_ParameterBase.keyword_.field_2;
  (this->GradientNormEpsilon).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_d0;
  (this->GradientNormEpsilon).super_ParameterBase.keyword_._M_string_length = 0;
  (this->GradientNormEpsilon).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->GradientNormEpsilon).super_ParameterBase.optional_ = false;
  (this->GradientNormEpsilon).super_ParameterBase.defaultValue_ = false;
  (this->GradientNormEpsilon).super_ParameterBase.empty_ = true;
  (this->GradientNormEpsilon).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033ace0;
  local_d8 = &(this->InitialStepSize).super_ParameterBase.keyword_.field_2;
  (this->InitialStepSize).super_ParameterBase.keyword_._M_dataplus._M_p = (pointer)local_d8;
  (this->InitialStepSize).super_ParameterBase.keyword_._M_string_length = 0;
  (this->InitialStepSize).super_ParameterBase.keyword_.field_2._M_local_buf[0] = '\0';
  (this->InitialStepSize).super_ParameterBase.optional_ = false;
  (this->InitialStepSize).super_ParameterBase.defaultValue_ = false;
  local_50 = (string *)&(this->MaxIterations).super_ParameterBase.keyword_;
  (this->InitialStepSize).super_ParameterBase.empty_ = true;
  local_68 = &(this->MaxStationaryStateIterations).super_ParameterBase;
  (this->InitialStepSize).super_ParameterBase._vptr_ParameterBase =
       (_func_int **)&PTR__ParameterBase_0033ace0;
  paVar3 = &local_120.first.field_2;
  local_60 = (string *)&(this->MaxStationaryStateIterations).super_ParameterBase.keyword_;
  local_78 = &(this->RootEpsilon).super_ParameterBase;
  local_70 = (string *)&(this->RootEpsilon).super_ParameterBase.keyword_;
  local_88 = &(this->FunctionEpsilon).super_ParameterBase;
  local_80 = (string *)&(this->FunctionEpsilon).super_ParameterBase.keyword_;
  local_98 = &(this->GradientNormEpsilon).super_ParameterBase;
  local_90 = (string *)&(this->GradientNormEpsilon).super_ParameterBase.keyword_;
  local_a0 = (string *)&(this->InitialStepSize).super_ParameterBase.keyword_;
  local_120.first._M_dataplus._M_p = (pointer)paVar3;
  local_40 = psVar2;
  local_38 = &this->UseMinimizer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"useMinimizer","");
  std::__cxx11::string::_M_assign((string *)psVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  (this->UseMinimizer).super_ParameterBase.optional_ = true;
  (this->UseMinimizer).super_ParameterBase.defaultValue_ = true;
  (this->UseMinimizer).super_ParameterBase.empty_ = false;
  (this->UseMinimizer).super_ParameterBase.field_0x2b = 0;
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"useMinimizer","");
  this_00 = &(this->super_DataHolder).parameters_;
  if (local_f8 == &local_e8) {
    local_120.first.field_2._8_8_ = local_e8._8_8_;
    local_120.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_120.first._M_dataplus._M_p = (pointer)local_f8;
  }
  local_120.first.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_120.first.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_120.first._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_120.second = &(this->UseMinimizer).super_ParameterBase;
  local_f8 = &local_e8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  local_120.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"method","");
  std::__cxx11::string::_M_assign((string *)&(this->Method).super_ParameterBase.keyword_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  (this->Method).super_ParameterBase.optional_ = true;
  local_120.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"SD","");
  std::__cxx11::string::_M_assign((string *)&(this->Method).data_);
  (this->Method).super_ParameterBase.defaultValue_ = true;
  (this->Method).super_ParameterBase.empty_ = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"method","");
  if (local_f8 == &local_e8) {
    local_120.first.field_2._8_8_ = local_e8._8_8_;
    local_120.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_120.first._M_dataplus._M_p = (pointer)local_f8;
  }
  local_120.first.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_120.first.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_120.first._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_120.second = local_48;
  local_f8 = &local_e8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  local_120.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"maxIterations","");
  std::__cxx11::string::_M_assign(local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  (this->MaxIterations).super_ParameterBase.optional_ = true;
  (this->MaxIterations).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->MaxIterations).super_ParameterBase.field_0x2c = 1000;
  (this->MaxIterations).super_ParameterBase.empty_ = false;
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"maxIterations","");
  if (local_f8 == &local_e8) {
    local_120.first.field_2._8_8_ = local_e8._8_8_;
    local_120.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_120.first._M_dataplus._M_p = (pointer)local_f8;
  }
  local_120.first.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_120.first.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_120.first._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_120.second = local_58;
  local_f8 = &local_e8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  local_120.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"maxStationaryStateIterations","");
  std::__cxx11::string::_M_assign(local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  (this->MaxStationaryStateIterations).super_ParameterBase.optional_ = true;
  (this->MaxStationaryStateIterations).super_ParameterBase.defaultValue_ = true;
  *(undefined4 *)&(this->MaxStationaryStateIterations).super_ParameterBase.field_0x2c = 100;
  (this->MaxStationaryStateIterations).super_ParameterBase.empty_ = false;
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,"maxStationaryStateIterations","");
  if (local_f8 == &local_e8) {
    local_120.first.field_2._8_8_ = local_e8._8_8_;
    local_120.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_120.first._M_dataplus._M_p = (pointer)local_f8;
  }
  local_120.first.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_120.first.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_120.first._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_120.second = local_68;
  local_f8 = &local_e8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  local_120.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"rootEpsilon","");
  std::__cxx11::string::_M_assign(local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  (this->RootEpsilon).super_ParameterBase.optional_ = true;
  (this->RootEpsilon).super_ParameterBase.defaultValue_ = true;
  (this->RootEpsilon).data_ = 1e-05;
  (this->RootEpsilon).super_ParameterBase.empty_ = false;
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"rootEpsilon","");
  if (local_f8 == &local_e8) {
    local_120.first.field_2._8_8_ = local_e8._8_8_;
    local_120.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_120.first._M_dataplus._M_p = (pointer)local_f8;
  }
  local_120.first.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_120.first.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_120.first._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_120.second = local_78;
  local_f8 = &local_e8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  local_120.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"functionEpsilon","");
  std::__cxx11::string::_M_assign(local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  (this->FunctionEpsilon).super_ParameterBase.optional_ = true;
  (this->FunctionEpsilon).super_ParameterBase.defaultValue_ = true;
  (this->FunctionEpsilon).data_ = 1e-05;
  (this->FunctionEpsilon).super_ParameterBase.empty_ = false;
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"functionEpsilon","");
  if (local_f8 == &local_e8) {
    local_120.first.field_2._8_8_ = local_e8._8_8_;
    local_120.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_120.first._M_dataplus._M_p = (pointer)local_f8;
  }
  local_120.first.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_120.first.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_120.first._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_120.second = local_88;
  local_f8 = &local_e8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  local_120.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"gradientNormEpsilon","");
  std::__cxx11::string::_M_assign(local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  (this->GradientNormEpsilon).super_ParameterBase.optional_ = true;
  (this->GradientNormEpsilon).super_ParameterBase.defaultValue_ = true;
  (this->GradientNormEpsilon).data_ = 1e-05;
  (this->GradientNormEpsilon).super_ParameterBase.empty_ = false;
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"gradientNormEpsilon","");
  if (local_f8 == &local_e8) {
    local_120.first.field_2._8_8_ = local_e8._8_8_;
    local_120.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_120.first._M_dataplus._M_p = (pointer)local_f8;
  }
  local_120.first.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_120.first.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_120.first._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_120.second = local_98;
  local_f8 = &local_e8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  local_120.first._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"initialStepSize","");
  std::__cxx11::string::_M_assign(local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  (this->InitialStepSize).super_ParameterBase.optional_ = true;
  (this->InitialStepSize).super_ParameterBase.defaultValue_ = true;
  (this->InitialStepSize).data_ = 0.1;
  (this->InitialStepSize).super_ParameterBase.empty_ = false;
  local_f8 = &local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"initialStepSize","");
  if (local_f8 == &local_e8) {
    local_120.first.field_2._8_8_ = local_e8._8_8_;
    local_120.first._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_120.first._M_dataplus._M_p = (pointer)local_f8;
  }
  local_120.first.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_120.first.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_120.first._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  local_120.second = &(this->InitialStepSize).super_ParameterBase;
  local_f8 = &local_e8;
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,ParameterBase*>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,ParameterBase*>,std::_Select1st<std::pair<std::__cxx11::string_const,ParameterBase*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,ParameterBase*>>>
              *)this_00,&local_120);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_120.first._M_dataplus._M_p,
                    local_120.first.field_2._M_allocated_capacity + 1);
  }
  if (local_f8 != &local_e8) {
    operator_delete(local_f8,CONCAT71(local_e8._M_allocated_capacity._1_7_,local_e8._M_local_buf[0])
                             + 1);
  }
  return;
}

Assistant:

MinimizerParameters::MinimizerParameters() {
    DefineOptionalParameterWithDefaultValue(UseMinimizer, "useMinimizer",
                                            false);
    DefineOptionalParameterWithDefaultValue(Method, "method", "SD");
    DefineOptionalParameterWithDefaultValue(MaxIterations, "maxIterations",
                                            1000);
    DefineOptionalParameterWithDefaultValue(
        MaxStationaryStateIterations, "maxStationaryStateIterations", 100);
    DefineOptionalParameterWithDefaultValue(RootEpsilon, "rootEpsilon", 1e-5);
    DefineOptionalParameterWithDefaultValue(FunctionEpsilon, "functionEpsilon",
                                            1e-5);
    DefineOptionalParameterWithDefaultValue(GradientNormEpsilon,
                                            "gradientNormEpsilon", 1e-5);
    DefineOptionalParameterWithDefaultValue(InitialStepSize, "initialStepSize",
                                            0.1);
  }